

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.h
# Opt level: O2

void __thiscall CVmObjFrameRef::get_targobj(CVmObjFrameRef *this,vm_val_t *result)

{
  vm_obj_id_t vVar1;
  long *plVar2;
  long lVar3;
  vm_obj_id_t *pvVar4;
  
  plVar2 = (long *)(this->super_CVmObject).ext_;
  lVar3 = *plVar2;
  if (lVar3 == 0) {
    pvVar4 = (vm_obj_id_t *)((long)plVar2 + 0x3c);
  }
  else {
    if (*(int *)(lVar3 + -0xa0) == 1) {
      (result->val).obj = 0;
      goto LAB_00253336;
    }
    pvVar4 = (vm_obj_id_t *)(lVar3 + -0x98);
  }
  vVar1 = *pvVar4;
  result->typ = VM_OBJ;
  (result->val).obj = vVar1;
  if (vVar1 != 0) {
    return;
  }
LAB_00253336:
  result->typ = VM_NIL;
  return;
}

Assistant:

vm_frameref_ext *get_ext() const { return (vm_frameref_ext *)ext_; }